

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void vli_modInv_update(uECC_word_t *uv,uECC_word_t *mod,wordcount_t num_words)

{
  uECC_word_t local_28;
  uECC_word_t carry;
  wordcount_t num_words_local;
  uECC_word_t *mod_local;
  uECC_word_t *uv_local;
  
  local_28 = 0;
  if ((*uv & 1) != 0) {
    local_28 = uECC_vli_add(uv,uv,mod,num_words);
  }
  uECC_vli_rshift1(uv,num_words);
  if (local_28 != 0) {
    uv[num_words + -1] = uv[num_words + -1] | 0x8000000000000000;
  }
  return;
}

Assistant:

static void vli_modInv_update(uECC_word_t *uv,
                              const uECC_word_t *mod,
                              wordcount_t num_words) {
    uECC_word_t carry = 0;
    if (!EVEN(uv)) {
        carry = uECC_vli_add(uv, uv, mod, num_words);
    }
    uECC_vli_rshift1(uv, num_words);
    if (carry) {
        uv[num_words - 1] |= HIGH_BIT_SET;
    }
}